

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

Maybe<capnp::StructSchema::Field> * __thiscall
capnp::StructSchema::getFieldByDiscriminant
          (Maybe<capnp::StructSchema::Field> *__return_storage_ptr__,StructSchema *this,
          uint16_t discriminant)

{
  undefined6 in_register_00000012;
  uint index;
  FieldSubset unionFields;
  FieldSubset local_60;
  
  getUnionFields(&local_60,this);
  index = (uint)CONCAT62(in_register_00000012,discriminant);
  if (index < local_60.size_) {
    FieldSubset::operator[](&(__return_storage_ptr__->ptr).field_1.value,&local_60,index);
  }
  (__return_storage_ptr__->ptr).isSet = index < local_60.size_;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<StructSchema::Field> StructSchema::getFieldByDiscriminant(uint16_t discriminant) const {
  auto unionFields = getUnionFields();

  if (discriminant >= unionFields.size()) {
    return kj::none;
  } else {
    return unionFields[discriminant];
  }
}